

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanAliasOrAnchor(Scanner *this,bool IsAlias)

{
  byte bVar1;
  uint AtColumn;
  byte *Position;
  byte *Position_00;
  Child local_68;
  byte *local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Position = (byte *)this->Current;
  AtColumn = this->Column;
  skip(this,1);
  Position_00 = (byte *)this->Current;
  while( true ) {
    bVar1 = *Position_00;
    if ((((bVar1 - 0x2c < 0x32) && ((0x2800000004001U >> ((ulong)(bVar1 - 0x2c) & 0x3f) & 1) != 0))
        || (bVar1 == 0x7b)) || (bVar1 == 0x7d)) break;
    Position_00 = (byte *)skip_ns_char(this,(iterator)Position_00);
    if (Position_00 == (byte *)this->Current) break;
    this->Current = (iterator)Position_00;
    this->Column = this->Column + 1;
  }
  if (Position == Position_00) {
    Twine::Twine((Twine *)&local_68,"Got empty alias or anchor");
    setError(this,(Twine *)&local_68,(iterator)Position);
  }
  else {
    local_50 = &local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_68.decUI = IsAlias ^ 0x15;
    local_58 = (long)Position_00 - (long)Position;
    local_60 = Position;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)&local_68);
    saveSimpleKeyCandidate
              (this,(iterator)
                    (this->TokenQueue).List.Sentinel.
                    super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                    .super_node_base_type.Prev,AtColumn,false);
    this->IsSimpleKeyAllowed = false;
    std::__cxx11::string::_M_dispose();
  }
  return Position != Position_00;
}

Assistant:

bool Scanner::scanAliasOrAnchor(bool IsAlias) {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  skip(1);
  while(true) {
    if (   *Current == '[' || *Current == ']'
        || *Current == '{' || *Current == '}'
        || *Current == ','
        || *Current == ':')
      break;
    StringRef::iterator i = skip_ns_char(Current);
    if (i == Current)
      break;
    Current = i;
    ++Column;
  }

  if (Start == Current) {
    setError("Got empty alias or anchor", Start);
    return false;
  }

  Token T;
  T.Kind = IsAlias ? Token::TK_Alias : Token::TK_Anchor;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  // Alias and anchors can be simple keys.
  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}